

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

void __thiscall
Nova::Grid<float,_3>::Cell
          (Grid<float,_3> *this,TV *location,T_INDEX *index,int number_of_ghost_cells)

{
  int i;
  long lVar1;
  Vector<float,_3,_true> data_copy;
  undefined8 local_c;
  int local_4;
  
  data_copy._data._M_elems[2] = (location->_data)._M_elems[2];
  data_copy._data._M_elems._0_8_ = *(undefined8 *)(location->_data)._M_elems;
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) -
         *(float *)((long)(this->domain).min_corner._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) *
         *(float *)((long)(this->one_over_dX)._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) + (float)(number_of_ghost_cells + 1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  lVar1 = 0;
  do {
    *(int *)((long)&local_c + lVar1 * 4) = (int)data_copy._data._M_elems[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    *(int *)((long)&local_c + lVar1) = *(int *)((long)&local_c + lVar1) - number_of_ghost_cells;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  (index->_data)._M_elems[2] = local_4;
  *(undefined8 *)(index->_data)._M_elems = local_c;
  return;
}

Assistant:

Vector(const Vector& other)
        :_data(other._data)
    {}